

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

Vec_Str_t *
Bmc_CollapseOne_int2
          (sat_solver *pSat1,sat_solver *pSat2,int nVars,int nCubeLim,int nBTLimit,int fCanon,
          int fReverse,int fVerbose)

{
  char cVar1;
  int iVar2;
  sat_solver *psVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  uint *puVar7;
  Vec_Int_t *p;
  int iVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  void *pvVar12;
  undefined8 *puVar13;
  Vec_Int_t *pVVar14;
  int *piVar15;
  Vec_Int_t *vTemp;
  uint **ppuVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  sat_solver **ppsVar20;
  long *plVar21;
  uint uVar22;
  long *plVar23;
  long lVar24;
  Vec_Str_t *vSop;
  char *pcVar25;
  uint uVar26;
  uint uVar27;
  int i;
  uint uVar28;
  double dVar29;
  int pLits [2];
  int fComplete [2];
  timespec ts;
  sat_solver *pSat [2];
  uint local_10c;
  int local_f0;
  lit local_ec;
  uint *local_e8 [3];
  long local_d0;
  Vec_Int_t *local_c8;
  int local_c0 [2];
  long local_b8;
  long local_b0;
  timespec local_a8;
  int local_94;
  ulong local_90;
  long *local_88;
  Vec_Int_t *local_80;
  sat_solver *local_78 [2];
  uint **local_68;
  int local_5c;
  long local_58 [2];
  sat_solver *local_48;
  long local_40;
  long *local_38;
  
  local_94 = nBTLimit;
  local_78[0] = pSat1;
  local_78[1] = pSat2;
  local_5c = fCanon;
  puVar11 = (uint *)malloc(0x10);
  puVar11[0] = 1000;
  puVar11[1] = 0;
  pvVar12 = malloc(1000);
  *(void **)(puVar11 + 2) = pvVar12;
  local_e8[0] = puVar11;
  puVar13 = (undefined8 *)malloc(0x10);
  *puVar13 = 1000;
  pvVar12 = malloc(1000);
  puVar13[1] = pvVar12;
  uVar26 = nVars + 1;
  local_e8[1] = (uint *)puVar13;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  uVar28 = 0x10;
  if (0xe < (uint)nVars) {
    uVar28 = uVar26;
  }
  pVVar14->nSize = 0;
  pVVar14->nCap = uVar28;
  lVar24 = (long)(int)uVar28;
  if (uVar28 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar24 * 4);
  }
  pVVar14->pArray = piVar15;
  local_80 = (Vec_Int_t *)malloc(0x10);
  local_80->nSize = 0;
  local_80->nCap = uVar28;
  if (uVar28 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar24 * 4);
  }
  local_80->pArray = piVar15;
  local_c8 = (Vec_Int_t *)malloc(0x10);
  local_c8->nSize = 0;
  local_c8->nCap = uVar28;
  if (uVar28 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar24 * 4);
  }
  local_c8->pArray = piVar15;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nSize = 0;
  vTemp->nCap = uVar28;
  if (uVar28 == 0) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)malloc(lVar24 << 2);
  }
  vTemp->pArray = piVar15;
  local_b8 = 0;
  local_b0 = 0;
  local_58[0] = 0;
  local_40 = 0;
  local_c0[0] = 0;
  local_c0[1] = 0;
  if (fReverse == 0) {
    if (0 < nVars) {
      iVar8 = 3;
      do {
        Vec_IntPush(pVVar14,iVar8);
        iVar2 = iVar8 - nVars;
        iVar8 = iVar8 + 1;
      } while (iVar2 != 2);
    }
  }
  else if (0 < nVars) {
    do {
      Vec_IntPush(pVVar14,uVar26 + 1);
      uVar26 = uVar26 - 1;
    } while (1 < uVar26);
  }
  lVar24 = (long)local_94;
  ppsVar20 = local_78;
  ppuVar16 = local_e8;
  pcVar25 = " 0\n";
  bVar5 = true;
  iVar8 = 4;
LAB_0058faea:
  local_f0 = iVar8;
  psVar3 = *ppsVar20;
  iVar8 = sat_solver_solve(psVar3,&local_f0,&local_ec,lVar24,0,0,0);
  puVar11 = local_e8[0];
  if (iVar8 == 0) {
    local_10c = 0;
  }
  else {
    if (iVar8 != -1) goto code_r0x0058fb25;
    local_e8[0][1] = 0;
    uVar28 = 0;
    lVar24 = 0;
    while( true ) {
      cVar1 = pcVar25[lVar24];
      if (uVar28 == *puVar11) {
        if ((int)uVar28 < 0x10) {
          if (*(void **)(puVar11 + 2) == (void *)0x0) {
            pvVar12 = malloc(0x10);
          }
          else {
            pvVar12 = realloc(*(void **)(puVar11 + 2),0x10);
          }
          *(void **)(puVar11 + 2) = pvVar12;
          *puVar11 = 0x10;
        }
        else {
          uVar28 = uVar28 * 2;
          if (*(void **)(puVar11 + 2) == (void *)0x0) {
            pvVar12 = malloc((ulong)uVar28);
          }
          else {
            pvVar12 = realloc(*(void **)(puVar11 + 2),(ulong)uVar28);
          }
          *(void **)(puVar11 + 2) = pvVar12;
          *puVar11 = uVar28;
        }
      }
      else {
        pvVar12 = *(void **)(puVar11 + 2);
      }
      puVar7 = local_e8[0];
      uVar28 = puVar11[1];
      puVar11[1] = uVar28 + 1;
      *(char *)((long)pvVar12 + (long)(int)uVar28) = cVar1;
      if (lVar24 == 2) break;
      uVar28 = puVar11[1];
      lVar24 = lVar24 + 1;
    }
    uVar28 = local_e8[0][1];
    if (uVar28 == *local_e8[0]) {
      if ((int)uVar28 < 0x10) {
        if (*(void **)(local_e8[0] + 2) == (void *)0x0) {
          pvVar12 = malloc(0x10);
        }
        else {
          pvVar12 = realloc(*(void **)(local_e8[0] + 2),0x10);
        }
        *(void **)(puVar7 + 2) = pvVar12;
        *puVar7 = 0x10;
      }
      else {
        sVar4 = (ulong)uVar28 * 2;
        if (*(void **)(local_e8[0] + 2) == (void *)0x0) {
          pvVar12 = malloc(sVar4);
        }
        else {
          pvVar12 = realloc(*(void **)(local_e8[0] + 2),sVar4);
        }
        *(void **)(puVar7 + 2) = pvVar12;
        *puVar7 = (uint)sVar4;
      }
    }
    else {
      pvVar12 = *(void **)(local_e8[0] + 2);
    }
    uVar28 = puVar7[1];
    puVar7[1] = uVar28 + 1;
    *(undefined1 *)((long)pvVar12 + (long)(int)uVar28) = 0;
    local_c0[0] = 1;
    local_10c = 0;
  }
  goto LAB_00590342;
code_r0x0058fb25:
  iVar8 = sat_solver_addclause(psVar3,&local_f0,&local_ec);
  if (iVar8 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x4f7,
                  "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                 );
  }
  puVar11 = *ppuVar16;
  uVar28 = puVar11[1];
  if (uVar28 == *puVar11) {
    if ((int)uVar28 < 0x10) {
      if (*(void **)(puVar11 + 2) == (void *)0x0) {
        pvVar12 = malloc(0x10);
      }
      else {
        pvVar12 = realloc(*(void **)(puVar11 + 2),0x10);
      }
      *(void **)(puVar11 + 2) = pvVar12;
      *puVar11 = 0x10;
    }
    else {
      sVar4 = (ulong)uVar28 * 2;
      if (*(void **)(puVar11 + 2) == (void *)0x0) {
        pvVar12 = malloc(sVar4);
      }
      else {
        pvVar12 = realloc(*(void **)(puVar11 + 2),sVar4);
      }
      *(void **)(puVar11 + 2) = pvVar12;
      *puVar11 = (uint)sVar4;
    }
  }
  else {
    pvVar12 = *(void **)(puVar11 + 2);
  }
  uVar28 = puVar11[1];
  puVar11[1] = uVar28 + 1;
  *(undefined1 *)((long)pvVar12 + (long)(int)uVar28) = 0;
  pcVar25 = " 1\n";
  ppuVar16 = local_e8 + 1;
  ppsVar20 = local_78 + 1;
  bVar6 = !bVar5;
  bVar5 = false;
  iVar8 = 5;
  if (bVar6) goto code_r0x0058fbe3;
  goto LAB_0058faea;
code_r0x0058fbe3:
  local_10c = 0;
  if (-1 < nCubeLim) {
    local_d0 = 0;
    local_10c = 0;
    do {
      ppuVar16 = local_e8;
      plVar23 = &local_b8;
      plVar21 = &local_b0;
      ppsVar20 = local_78;
      local_90 = 0;
      bVar5 = true;
      do {
        bVar6 = bVar5;
        local_88 = plVar23;
        local_38 = plVar21;
        local_68 = ppuVar16;
        if (fVerbose != 0) {
          iVar8 = clock_gettime(3,&local_a8);
          if (iVar8 < 0) {
            local_d0 = -1;
          }
          else {
            local_d0 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
          }
        }
        local_48 = *ppsVar20;
        piVar15 = pVVar14->pArray;
        iVar8 = pVVar14->nSize;
        lVar24 = (long)iVar8;
        if (0 < lVar24) {
          lVar17 = 0;
          do {
            local_48->polarity[piVar15[lVar17]] = '\0';
            lVar17 = lVar17 + 1;
          } while (lVar24 != lVar17);
        }
        iVar2 = *(int *)(&DAT_009f4900 + local_90 * 4);
        local_f0 = iVar2 * 2 + 1;
        iVar9 = sat_solver_solve(local_48,&local_f0,&local_ec,0,0,0,0);
        if (fVerbose != 0) {
          iVar10 = clock_gettime(3,&local_a8);
          if (iVar10 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
          }
          *local_88 = *local_88 + (lVar17 - local_d0);
        }
        psVar3 = local_48;
        p = local_80;
        if (iVar9 == -1) {
LAB_005901b5:
          local_c0[local_90] = 1;
          break;
        }
        if (iVar9 == 0) goto LAB_00590342;
        local_80->nSize = 0;
        if (0 < iVar8) {
          lVar17 = 0;
          do {
            iVar8 = piVar15[lVar17];
            if (((long)iVar8 < 0) || (psVar3->size <= iVar8)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            Vec_IntPush(p,(uint)(psVar3->model[iVar8] != 1) + iVar8 * 2);
            lVar17 = lVar17 + 1;
          } while (lVar24 != lVar17);
        }
        if (fVerbose != 0) {
          iVar8 = clock_gettime(3,&local_a8);
          if (iVar8 < 0) {
            local_d0 = -1;
          }
          else {
            local_d0 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
          }
        }
        iVar8 = Bmc_CollapseExpand(local_78[local_90 ^ 1],(sat_solver *)0x0,p,local_c8,vTemp,
                                   local_94,local_5c,-1);
        if (fVerbose != 0) {
          iVar9 = clock_gettime(3,&local_a8);
          if (iVar9 < 0) {
            lVar24 = -1;
          }
          else {
            lVar24 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
          }
          *local_38 = *local_38 + (lVar24 - local_d0);
        }
        if (iVar8 < 0) goto LAB_00590342;
        puVar11 = *local_68;
        uVar28 = puVar11[1];
        if ((int)uVar28 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x249,"char Vec_StrPop(Vec_Str_t *)");
        }
        pvVar12 = *(void **)(puVar11 + 2);
        uVar26 = uVar28 - 1;
        puVar11[1] = uVar26;
        uVar22 = nVars + uVar28 + 3;
        local_88 = (long *)CONCAT44(local_88._4_4_,uVar26);
        if ((int)uVar28 <= (int)uVar22) {
          uVar27 = *puVar11 * 2;
          uVar19 = (ulong)uVar22;
          if ((int)uVar27 < (int)uVar22) {
            uVar27 = uVar22;
            if (pvVar12 == (void *)0x0) {
              pvVar12 = malloc(uVar19);
            }
            else {
              pvVar12 = realloc(pvVar12,uVar19);
            }
LAB_0058ffaa:
            *(void **)(puVar11 + 2) = pvVar12;
            *puVar11 = uVar27;
            uVar26 = puVar11[1];
          }
          else if ((int)*puVar11 < (int)uVar22) {
            if (pvVar12 == (void *)0x0) {
              pvVar12 = malloc((ulong)uVar27);
            }
            else {
              pvVar12 = realloc(pvVar12,(ulong)uVar27);
            }
            goto LAB_0058ffaa;
          }
          if ((int)uVar26 < (int)uVar22) {
            uVar18 = (ulong)(int)uVar26;
            do {
              *(undefined1 *)(*(long *)(puVar11 + 2) + uVar18) = 0x2d;
              uVar18 = uVar18 + 1;
            } while (uVar19 != uVar18);
          }
          puVar11[1] = uVar22;
          uVar26 = uVar22;
        }
        uVar22 = (nVars + uVar28) - 1;
        if (((int)uVar22 < 0) || ((int)uVar26 <= (int)uVar22)) {
LAB_005905ff:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        uVar19 = (ulong)uVar22;
        *(undefined1 *)(*(long *)(puVar11 + 2) + uVar19) = 0x20;
        if ((int)puVar11[1] <= (int)(uVar28 + nVars)) goto LAB_005905ff;
        *(byte *)(*(long *)(puVar11 + 2) + (ulong)(uVar28 + nVars)) = bVar6 | 0x30;
        if ((int)puVar11[1] <= (int)(uVar19 + 2)) goto LAB_005905ff;
        local_68 = (uint **)CONCAT44(local_68._4_4_,uVar22);
        *(undefined1 *)(*(long *)(puVar11 + 2) + uVar19 + 2) = 10;
        if ((int)puVar11[1] <= (int)(uVar19 + 3)) goto LAB_005905ff;
        *(undefined1 *)(*(long *)(puVar11 + 2) + uVar19 + 3) = 0;
        vTemp->nSize = 0;
        Vec_IntPush(vTemp,iVar2 * 2);
        iVar8 = local_c8->nSize;
        if (0 < (long)iVar8) {
          piVar15 = local_c8->pArray;
          lVar24 = 0;
          do {
            uVar28 = piVar15[lVar24];
            if (((long)(int)uVar28 < 0) || (local_80->nSize <= (int)uVar28)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar26 = local_80->pArray[(int)uVar28];
            if ((int)uVar26 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            Vec_IntPush(vTemp,uVar26 ^ 1);
            if (fReverse == 0) {
              uVar28 = uVar28 + (int)local_88;
            }
            else {
              uVar28 = ~uVar28 + (int)local_68;
              if ((int)uVar28 < 0) goto LAB_005905ff;
            }
            if ((int)puVar11[1] <= (int)uVar28) goto LAB_005905ff;
            *(byte *)(*(long *)(puVar11 + 2) + (ulong)uVar28) = (byte)uVar26 & 1 ^ 0x31;
            lVar24 = lVar24 + 1;
          } while (iVar8 != lVar24);
        }
        iVar8 = sat_solver_addclause(local_48,vTemp->pArray,vTemp->pArray + vTemp->nSize);
        if (iVar8 != 1) {
          if (iVar8 != 0) {
            __assert_fail("status == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                          ,0x536,
                          "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                         );
          }
          goto LAB_005901b5;
        }
        local_90 = 1;
        plVar23 = local_58;
        plVar21 = &local_40;
        ppuVar16 = local_e8 + 1;
        ppsVar20 = local_78 + 1;
        bVar5 = false;
      } while (bVar6);
    } while ((local_c0[1] == 0 && local_c0[0] == 0) &&
            (local_10c = local_10c + 1, (int)local_10c < nCubeLim || nCubeLim == 0));
  }
LAB_00590342:
  if (pVVar14->pArray != (int *)0x0) {
    free(pVVar14->pArray);
  }
  free(pVVar14);
  pVVar14 = local_80;
  if (local_80->pArray != (int *)0x0) {
    free(local_80->pArray);
  }
  free(pVVar14);
  if (local_c8->pArray != (int *)0x0) {
    free(local_c8->pArray);
  }
  free(local_c8);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  if (local_c0[1] != 0 && local_c0[0] != 0) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x540,
                  "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                 );
  }
  if (local_c0[0] == 0 && local_c0[1] == 0) {
    if (fVerbose == 0) {
      vSop = (Vec_Str_t *)0x0;
      goto LAB_0059056c;
    }
    printf("Processed output with %d supp vars. ",(ulong)(uint)nVars);
LAB_0059045f:
    pcVar25 = "The resulting SOP exceeded %d cubes.\n";
    vSop = (Vec_Str_t *)0x0;
    uVar19 = (ulong)(uint)nCubeLim;
  }
  else {
    vSop = (Vec_Str_t *)local_e8[local_c0[1]];
    local_e8[local_c0[1]] = (uint *)0x0;
    if (1 < local_10c) {
      Bmc_CollapseIrredundantFull(vSop,vSop->nSize / (nVars + 3),nVars);
    }
    if (fVerbose == 0) goto LAB_0059056c;
    printf("Processed output with %d supp vars. ",(ulong)(uint)nVars);
    if (vSop == (Vec_Str_t *)0x0) goto LAB_0059045f;
    pcVar25 = "The best cover contains %d cubes.\n";
    uVar19 = (long)vSop->nSize / (long)(nVars + 3) & 0xffffffff;
  }
  printf(pcVar25,uVar19);
  dVar29 = (double)local_b8;
  iVar8 = (int)pcVar25;
  Abc_Print(iVar8,"%s =","Onset  minterm");
  Abc_Print(iVar8,"%9.2f sec\n",dVar29 / 1000000.0);
  dVar29 = (double)local_b0;
  Abc_Print(iVar8,"%s =","Onset  expand ");
  Abc_Print(iVar8,"%9.2f sec\n",dVar29 / 1000000.0);
  dVar29 = (double)local_58[0];
  Abc_Print(iVar8,"%s =","Offset minterm");
  Abc_Print(iVar8,"%9.2f sec\n",dVar29 / 1000000.0);
  dVar29 = (double)local_40;
  Abc_Print(iVar8,"%s =","Offset expand ");
  Abc_Print(iVar8,"%9.2f sec\n",dVar29 / 1000000.0);
LAB_0059056c:
  puVar11 = local_e8[0];
  if (local_e8[0] != (uint *)0x0) {
    if (*(void **)(local_e8[0] + 2) != (void *)0x0) {
      free(*(void **)(local_e8[0] + 2));
    }
    free(puVar11);
  }
  puVar11 = local_e8[1];
  if (local_e8[1] != (uint *)0x0) {
    if (*(void **)((long)local_e8[1] + 8) != (void *)0x0) {
      free(*(void **)((long)local_e8[1] + 8));
    }
    free(puVar11);
  }
  return vSop;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne_int2( sat_solver * pSat1, sat_solver * pSat2, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    sat_solver * pSat[2] = { pSat1, pSat2 };
    Vec_Str_t * vSop[2]  = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vVars = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars+1 );
    int n, v, iVar, pLits[2], iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};
    // variables
    int iOutVar    = 2;
    int iOOVars[2] = {0, 1};
//    int iOutVar    = 1;
//    int iOOVars[2] = {sat_solver_nvars(pSat) - 5, sat_solver_nvars(pSat) - 5 + 1};

    // collect CI variables (0 = onset enable, 1 = offset enable, 2 = output)
    int iCiVarBeg = 3;
//    int iCiVarBeg = sat_solver_nvars(pSat) - 5 - nVars;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        pLits[0] = Abc_Var2Lit( iOutVar, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], pLits, pLits + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], pLits, pLits + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
            pLits[0] = Abc_Var2Lit( iOOVars[n], 1 ); // enable clauses
//            pLits[1] = Abc_Var2Lit( iOutVar, n );    // set output
//            status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
            status = sat_solver_solve( pSat[n], pLits, pLits + 1, 0, 0, 0, 0 );
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntForEachEntry( vVars, iVar, v )
                Vec_IntPush( vLits, Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar)) );
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
//            status = Bmc_CollapseExpand( pSat, NULL, vLits, vNums, vCube, nBTLimit, fCanon, Abc_Var2Lit(iOutVar, !n) );
            status = Bmc_CollapseExpand( pSat[!n], NULL, vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntPush( vCube, Abc_Var2Lit( iOOVars[n], 0 ) );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                int iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
//            status = sat_solver_addclause( pSat, Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}